

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O1

Fra_Man_t * Fra_ManStart(Aig_Man_t *pManAig,Fra_Par_t *pPars)

{
  int iVar1;
  Fra_Man_t *__s;
  uint *puVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Fra_Cla_t *pFVar5;
  Aig_Obj_t **__s_00;
  long lVar6;
  uint uVar7;
  size_t __size;
  
  __s = (Fra_Man_t *)malloc(0x158);
  memset(__s,0,0x158);
  __s->pPars = pPars;
  __s->pManAig = pManAig;
  __s->nSizeAlloc = pManAig->vObjs->nSize;
  iVar1 = pPars->nFramesK + 1;
  __s->nFramesAll = iVar1;
  uVar7 = (pManAig->nObjs[2] - pManAig->nRegs) * iVar1 + pManAig->nRegs;
  iVar1 = (((int)uVar7 >> 5) + 1) - (uint)((uVar7 & 0x1f) == 0);
  __s->nPatWords = iVar1;
  puVar2 = (uint *)malloc((long)iVar1 << 2);
  __s->pPatWords = puVar2;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  __s->vPiVars = pVVar3;
  pFVar5 = Fra_ClassesStart(pManAig);
  __s->pCla = pFVar5;
  __size = (long)__s->nFramesAll * (long)__s->nSizeAlloc * 8;
  __s_00 = (Aig_Obj_t **)malloc(__size);
  __s->pMemFraig = __s_00;
  memset(__s_00,0,__size);
  Aig_ManRandom(1);
  pVVar3 = __s->pManAig->vObjs;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      if (pVVar3->pArray[lVar6] != (void *)0x0) {
        *(Fra_Man_t **)((long)pVVar3->pArray[lVar6] + 0x28) = __s;
      }
      lVar6 = lVar6 + 1;
      pVVar3 = __s->pManAig->vObjs;
    } while (lVar6 < pVVar3->nSize);
  }
  return __s;
}

Assistant:

Fra_Man_t * Fra_ManStart( Aig_Man_t * pManAig, Fra_Par_t * pPars )
{
    Fra_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    // allocate the fraiging manager
    p = ABC_ALLOC( Fra_Man_t, 1 );
    memset( p, 0, sizeof(Fra_Man_t) );
    p->pPars      = pPars;
    p->pManAig    = pManAig;
    p->nSizeAlloc = Aig_ManObjNumMax( pManAig );
    p->nFramesAll = pPars->nFramesK + 1;
    // allocate storage for sim pattern
    p->nPatWords  = Abc_BitWordNum( (Aig_ManCiNum(pManAig) - Aig_ManRegNum(pManAig)) * p->nFramesAll + Aig_ManRegNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // equivalence classes
    p->pCla       = Fra_ClassesStart( pManAig );
    // allocate other members
    p->pMemFraig  = ABC_ALLOC( Aig_Obj_t *, p->nSizeAlloc * p->nFramesAll );
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    // set random number generator
//    srand( 0xABCABC );
    Aig_ManRandom(1);
    // set the pointer to the manager
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->pData = p;
    return p;
}